

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsCreateString(char *content,size_t length,JsValueRef *value)

{
  ScriptContext *pSVar1;
  EventLog *this;
  JsErrorCode JVar2;
  int iVar3;
  charcount_t cVar4;
  JsrtContext *currentContext;
  JavascriptString *this_00;
  undefined4 extraout_var;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  TTDJsRTActionResultAutoRecorder local_48;
  
  JVar2 = JsErrorNullArgument;
  if (value != (JsValueRef *)0x0 && content != (char *)0x0) {
    *value = (JsValueRef)0x0;
    if (length == 0xffffffffffffffff) {
      length = strlen(content);
    }
    JVar2 = JsErrorOutOfMemory;
    if (length < 0x7fffffff) {
      local_48.m_actionEvent = (EventLogEntry *)0x0;
      local_48.m_resultPtr = (TTDVar *)0x0;
      currentContext = JsrtContext::GetCurrent();
      JVar2 = CheckContext(currentContext,false,false);
      if (JVar2 == JsNoError) {
        pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
        this_00 = Js::LiteralStringWithPropertyStringPtr::NewFromCString
                            (content,(CharCount)length,
                             (pSVar1->super_ScriptContextBase).javascriptLibrary);
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          this = pSVar1->threadContext->TTDLog;
          iVar3 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this_00);
          cVar4 = Js::JavascriptString::GetLength(this_00);
          TTD::EventLog::RecordJsRTCreateString
                    (this,&local_48,(char16 *)CONCAT44(extraout_var,iVar3),(ulong)cVar4);
        }
        *value = this_00;
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          if (local_48.m_resultPtr == (TTDVar *)0x0) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
          *local_48.m_resultPtr = this_00;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
        JVar2 = JsNoError;
      }
      if (local_48.m_actionEvent != (EventLogEntry *)0x0) {
        if ((local_48.m_actionEvent)->ResultStatus != -1) {
          TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
        }
        (local_48.m_actionEvent)->ResultStatus = JVar2;
      }
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsCreateString(
    _In_ const char *content,
    _In_ size_t length,
    _Out_ JsValueRef *value)
{
    PARAM_NOT_NULL(content);
    PARAM_NOT_NULL(value);
    *value = JS_INVALID_REFERENCE;

    if (length == static_cast<size_t>(-1))
    {
        length = strlen(content);
    }

    if (length > MaxCharCount)
    {
        return JsErrorOutOfMemory;
    }

    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        Js::JavascriptString *stringValue = Js::LiteralStringWithPropertyStringPtr::
            NewFromCString(content, (CharCount)length, scriptContext->GetLibrary());

        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateString, stringValue->GetSz(), stringValue->GetLength());

        *value = stringValue;

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, value);

        return JsNoError;
    });
}